

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall CommandDrawNumber::CommandDrawNumber(CommandDrawNumber *this,SBarInfo *script)

{
  (this->super_CommandDrawString).super_SBarInfoCommand.script = script;
  (this->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand =
       (_func_int **)&PTR__CommandDrawString_0070c750;
  (this->super_CommandDrawString).lineBreaks = false;
  (this->super_CommandDrawString).breakWidth = 0x140;
  (this->super_CommandDrawString).shadow = false;
  (this->super_CommandDrawString).shadowX = 2;
  (this->super_CommandDrawString).shadowY = 2;
  (this->super_CommandDrawString).spacing = 0;
  (this->super_CommandDrawString).font = (FFont *)0x0;
  (this->super_CommandDrawString).translation = CR_UNTRANSLATED;
  (this->super_CommandDrawString).cache = -1;
  (this->super_CommandDrawString).strValue = CONSTANT;
  (this->super_CommandDrawString).valueArgument = 0;
  (this->super_CommandDrawString).str.Chars = FString::NullString.Nothing;
  (this->super_CommandDrawString).alignment = ALIGN_RIGHT;
  (this->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand =
       (_func_int **)&PTR__CommandDrawNumber_0070c7a8;
  *(undefined8 *)&(this->super_CommandDrawString).field_0x5c = 0;
  this->drawValue = 0;
  this->length = 3;
  this->lowValue = -1;
  this->lowTranslation = CR_UNTRANSLATED;
  this->highValue = -1;
  this->highTranslation = CR_UNTRANSLATED;
  this->value = CONSTANT;
  this->inventoryItem = (PClassActor *)0x0;
  (this->prefixPadding).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  FString::FString(&this->cvarName,(char *)0x0);
  return;
}

Assistant:

CommandDrawNumber(SBarInfo *script) : CommandDrawString(script),
			fillZeros(false), whenNotZero(false), dontCap(false),
			usePrefix(false), interpolationSpeed(0), drawValue(0), length(3),
			lowValue(-1), lowTranslation(CR_UNTRANSLATED), highValue(-1),
			highTranslation(CR_UNTRANSLATED), value(CONSTANT),
			inventoryItem(NULL), cvarName(nullptr)
		{
		}